

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils-io.c
# Opt level: O3

_Bool clean_tempfile(char *dest,GError **error)

{
  int iVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  int *piVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  _Bool _Var7;
  
  if (tmpfile_path == (char *)0x0) {
    _Var7 = true;
  }
  else {
    if (prev_fh != (FILE *)0x0) {
      fclose((FILE *)out_fh);
      out_fh = prev_fh;
    }
    iVar1 = rename(tmpfile_path,dest);
    _Var7 = iVar1 == 0;
    if (!_Var7) {
      piVar4 = __errno_location();
      iVar1 = *piVar4;
      uVar2 = g_file_error_quark();
      uVar3 = g_file_error_from_errno(iVar1);
      uVar5 = dcgettext(0,"%s. Temp file \'%s\' can\'t be moved to destination.",5);
      uVar6 = g_strerror(iVar1);
      g_set_error(error,uVar2,uVar3,uVar5,uVar6,tmpfile_path);
    }
    g_free(tmpfile_path);
  }
  return _Var7;
}

Assistant:

bool
clean_tempfile   (char      *dest,
                  GError   **error)
{
    int result;

    if (tmpfile_path == NULL)
        return true;

    if (prev_fh)
    {
        fclose (out_fh);
        out_fh = prev_fh;
    }

    if (0 != (result = g_rename (tmpfile_path, dest)))
    {
        int e = errno;
        g_set_error (error, G_FILE_ERROR, g_file_error_from_errno(e),
            _("%s. Temp file '%s' can't be moved to destination."),
            g_strerror(e), tmpfile_path);
    }
    g_free (tmpfile_path);

    return (result == 0);
}